

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leadingNumbers.cpp
# Opt level: O3

void __thiscall leadingNumbers_power_Test::TestBody(leadingNumbers_power_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  size_t index;
  double res;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  size_t local_28;
  double local_20;
  double local_18;
  
  local_28 = 0;
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"3^2","");
  local_20 = units::detail::testing::testLeadingNumber((string *)local_48,&local_28);
  if (local_48 != (undefined1  [8])&local_38) {
    local_18 = local_20;
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
    local_20 = local_18;
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4022000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_48,"res","9.0",&local_20,(double *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x42,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_58._M_head_impl._0_4_ = 3;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((internal *)local_48,"index","3U",&local_28,(uint *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x43,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"10.0^-2","");
  local_20 = units::detail::testing::testLeadingNumber((string *)local_48,&local_28);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_48,"res","0.01",local_20,0.01);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x46,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"3.1^4.3houses","");
  local_20 = units::detail::testing::testLeadingNumber((string *)local_48,&local_28);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_48,"res","pow(3.1, 4.3)",local_20,129.67470942124882);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_58._M_head_impl._0_4_ = 7;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((internal *)local_48,"index","7U",&local_28,(uint *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST(leadingNumbers, power)
{
    size_t index{0U};
    auto res = testLeadingNumber("3^2", index);
    EXPECT_EQ(res, 9.0);
    EXPECT_GE(index, 3U);

    res = testLeadingNumber("10.0^-2", index);
    EXPECT_DOUBLE_EQ(res, 0.01);

    res = testLeadingNumber("3.1^4.3houses", index);
    EXPECT_DOUBLE_EQ(res, pow(3.1, 4.3));
    EXPECT_GE(index, 7U);
}